

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double beta_pdf(double x,double a,double b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = 0.0;
  if ((0.0 <= x) && (x <= 1.0)) {
    dVar2 = pow(x,a + -1.0);
    dVar3 = pow(1.0 - x,b + -1.0);
    dVar1 = r8_beta(a,b);
    dVar1 = (dVar3 * dVar2) / dVar1;
  }
  return dVar1;
}

Assistant:

double beta_pdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_PDF evaluates the Beta PDF.
//
//  Discussion:
//
//    PDF(A,B;X) = X^(A-1) * (1-X)^(B-1) / BETA(A,B).
//
//    A = B = 1 yields the Uniform distribution on [0,1].
//    A = B = 1/2 yields the Arcsin distribution.
//        B = 1 yields the power function distribution.
//    A = B -> Infinity tends to the Normal distribution.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//    0.0 <= X <= 1.0.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Output, double BETA_PDF, the value of the PDF.
//
{
  double pdf;

  if ( x < 0.0 || 1.0 < x )
  {
    pdf = 0.0;
  }
  else
  {
    pdf = pow ( x, ( a - 1.0 ) ) * pow ( ( 1.0 - x ), ( b - 1.0 ) ) 
      / r8_beta ( a, b );
  }

  return pdf;
}